

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KangarooTwelve.c
# Opt level: O0

uint right_encode(uchar *encbuf,size_t value)

{
  size_t v;
  uint i;
  uint n;
  size_t value_local;
  uchar *encbuf_local;
  
  n = 0;
  for (v = value; v != 0 && n < 8; v = v >> 8) {
    n = n + 1;
  }
  for (i = 1; i <= n; i = i + 1) {
    encbuf[i - 1] = (uchar)(value >> (((uchar)n - (char)i) * '\b' & 0x3f));
  }
  encbuf[n] = (uchar)n;
  return n + 1;
}

Assistant:

static unsigned int right_encode( unsigned char * encbuf, size_t value )
{
    unsigned int n, i;
    size_t v;

    for ( v = value, n = 0; v && (n < sizeof(size_t)); ++n, v >>= 8 )
        ; /* empty */
    for ( i = 1; i <= n; ++i )
        encbuf[i-1] = (unsigned char)(value >> (8 * (n-i)));
    encbuf[n] = (unsigned char)n;
    return n + 1;
}